

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QExplicitlySharedDataPointer<QPicturePrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QPicturePrivate> *this)

{
  QPicturePrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QPicturePrivate *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QPicturePrivate *)0x0) {
        QPicturePrivate::~QPicturePrivate(pQVar1);
      }
      operator_delete(pQVar1,0xb8);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }